

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall ncnn::Split::Split(Split *this)

{
  int iVar1;
  bool bVar2;
  
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_005d8998;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->super_Layer).support_vulkan = true;
  (this->super_Layer).support_packing = true;
  iVar1 = cpu_support_arm_asimdhp();
  bVar2 = true;
  if (iVar1 == 0) {
    iVar1 = cpu_support_riscv_zfh();
    bVar2 = iVar1 != 0;
  }
  (this->super_Layer).support_fp16_storage = bVar2;
  (this->super_Layer).support_bf16_storage = true;
  (this->super_Layer).support_image_storage = true;
  return;
}

Assistant:

Split::Split()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = true;
    support_packing = true;
    support_fp16_storage = cpu_support_arm_asimdhp() || cpu_support_riscv_zfh();
    support_bf16_storage = true;
    support_image_storage = true;
}